

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

lys_submodule * yin_read_submodule(lys_module *module,char *data,unres_schema *unres)

{
  byte bVar1;
  ly_ctx *ctx;
  int iVar2;
  lyxml_elem *elem;
  LY_ERR *pLVar3;
  char *pcVar4;
  lys_module *module_00;
  size_t len;
  unres_schema *local_38;
  unres_schema *unres_local;
  
  ctx = module->ctx;
  local_38 = unres;
  elem = lyxml_parse_mem(ctx,data,2);
  if (elem != (lyxml_elem *)0x0) {
    pcVar4 = elem->name;
    if ((pcVar4 == (char *)0x0) || (iVar2 = strcmp(pcVar4,"submodule"), iVar2 != 0)) {
      module_00 = (lys_module *)0x0;
      ly_vlog(ctx,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,pcVar4);
    }
    else {
      pcVar4 = lyxml_get_attr(elem,"name",(char *)0x0);
      if (pcVar4 == (char *)0x0) {
        module_00 = (lys_module *)0x0;
        ly_vlog(ctx,LYE_MISSARG,LY_VLOG_NONE,(void *)0x0,"name",elem->name);
      }
      else {
        module_00 = (lys_module *)0x0;
        iVar2 = lyp_check_identifier(ctx,pcVar4,LY_IDENT_NAME,(lys_module *)0x0,(lys_node *)0x0);
        if (iVar2 == 0) {
          module_00 = (lys_module *)calloc(1,0xb0);
          if (module_00 == (lys_module *)0x0) {
            module_00 = (lys_module *)0x0;
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_read_submodule");
          }
          else {
            module_00->ctx = ctx;
            len = strlen(pcVar4);
            pcVar4 = lydict_insert(ctx,pcVar4,len);
            module_00->name = pcVar4;
            bVar1 = module_00->field_0x40;
            module_00->field_0x40 = bVar1 | 1;
            module_00->field_0x40 = bVar1 & 0x7f | 1 | module->field_0x40 & 0x80;
            module_00->data = (lys_node *)module;
            iVar2 = lyp_check_circmod_add(module_00);
            if (iVar2 == 0) {
              ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Reading submodule \"%s\".",module_00->name);
              iVar2 = read_sub_module(module,(lys_submodule *)module_00,elem,local_38);
              if (iVar2 == 0) {
                lyp_sort_revisions(module_00);
                lyxml_free(ctx,elem);
                lyp_check_circmod_pop(ctx);
                ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Submodule \"%s\" successfully parsed.",
                       module_00->name);
                return (lys_submodule *)module_00;
              }
            }
          }
        }
      }
    }
    lyxml_free(ctx,elem);
    pLVar3 = ly_errno_glob_address();
    if (module_00 == (lys_module *)0x0) {
      ly_log(ctx,LY_LLERR,*pLVar3,"Submodule parsing failed.");
      return (lys_submodule *)0x0;
    }
    ly_log(ctx,LY_LLERR,*pLVar3,"Submodule \"%s\" parsing failed.",module_00->name);
    unres_schema_free(module_00,&local_38,0);
    lyp_check_circmod_pop(ctx);
    lys_sub_module_remove_devs_augs(module_00);
    lys_submodule_module_data_free((lys_submodule *)module_00);
    lys_submodule_free((lys_submodule *)module_00,(_func_void_lys_node_ptr_void_ptr *)0x0);
  }
  return (lys_submodule *)0x0;
}

Assistant:

struct lys_submodule *
yin_read_submodule(struct lys_module *module, const char *data, struct unres_schema *unres)
{
    struct ly_ctx *ctx = module->ctx;
    struct lyxml_elem *yin;
    struct lys_submodule *submodule = NULL;
    const char *value;

    yin = lyxml_parse_mem(ctx, data, LYXML_PARSE_NOMIXEDCONTENT);
    if (!yin) {
        return NULL;
    }

    /* check root element */
    if (!yin->name || strcmp(yin->name, "submodule")) {
        LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, yin->name);
        goto error;
    }

    GETVAL(ctx, value, yin, "name");
    if (lyp_check_identifier(ctx, value, LY_IDENT_NAME, NULL, NULL)) {
        goto error;
    }

    submodule = calloc(1, sizeof *submodule);
    LY_CHECK_ERR_GOTO(!submodule, LOGMEM(ctx), error);

    submodule->ctx = ctx;
    submodule->name = lydict_insert(ctx, value, strlen(value));
    submodule->type = 1;
    submodule->implemented = module->implemented;
    submodule->belongsto = module;

    /* add into the list of processed modules */
    if (lyp_check_circmod_add((struct lys_module *)submodule)) {
        goto error;
    }

    LOGVRB("Reading submodule \"%s\".", submodule->name);
    /* module cannot be changed in this case and 1 cannot be returned */
    if (read_sub_module(module, submodule, yin, unres)) {
        goto error;
    }

    lyp_sort_revisions((struct lys_module *)submodule);

    /* cleanup */
    lyxml_free(ctx, yin);
    lyp_check_circmod_pop(ctx);

    LOGVRB("Submodule \"%s\" successfully parsed.", submodule->name);
    return submodule;

error:
    /* cleanup */
    lyxml_free(ctx, yin);
    if (!submodule) {
        LOGERR(ctx, ly_errno, "Submodule parsing failed.");
        return NULL;
    }

    LOGERR(ctx, ly_errno, "Submodule \"%s\" parsing failed.", submodule->name);

    unres_schema_free((struct lys_module *)submodule, &unres, 0);
    lyp_check_circmod_pop(ctx);
    lys_sub_module_remove_devs_augs((struct lys_module *)submodule);
    lys_submodule_module_data_free(submodule);
    lys_submodule_free(submodule, NULL);
    return NULL;
}